

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O2

int inlist(char *filename)

{
  int iVar1;
  size_t sVar2;
  char **ppcVar3;
  char *__s2;
  
  ppcVar3 = files;
  __s2 = *files;
  iVar1 = 1;
  if (__s2 != (char *)0x0) {
    sVar2 = strlen(filename);
    while (ppcVar3 = ppcVar3 + 1, __s2 != (char *)0x0) {
      iVar1 = strncmp(filename,__s2,(long)(int)sVar2);
      if (iVar1 == 0) {
        return 1;
      }
      __s2 = *ppcVar3;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
inlist(char *filename)
{
	register int len = strlen(filename);
	register char **filelist = files;

	if (!*filelist)
		return (1);				/* no "files list" */

	while (*filelist)
#ifdef __MSDOS__
		if (strnicmp(filename, *filelist++, len) == 0)
#else
		if (strncmp(filename, *filelist++, len) == 0)
#endif							/* __MSDOS__ */
			return (1);
	return (0);
}